

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::Remove(SQVM *this,SQInteger n)

{
  SQObjectPtr *pSVar1;
  ulong uVar2;
  
  if (n < 0) {
    uVar2 = n + this->_top;
  }
  else {
    uVar2 = (n + this->_stackbase) - 1;
  }
  while ((long)uVar2 < this->_top) {
    pSVar1 = (this->_stack)._vals;
    SQObjectPtr::operator=(pSVar1 + (uVar2 & 0xffffffff),pSVar1 + (uVar2 + 1 & 0xffffffff));
    uVar2 = uVar2 + 1;
  }
  SQObjectPtr::Null((this->_stack)._vals + (this->_top & 0xffffffff));
  this->_top = this->_top + -1;
  return;
}

Assistant:

void SQVM::Remove(SQInteger n) {
    n = (n >= 0)?n + _stackbase - 1:_top + n;
    for(SQInteger i = n; i < _top; i++){
        _stack[i] = _stack[i+1];
    }
    _stack[_top].Null();
    _top--;
}